

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmDivl<(moira::Instr)154,(moira::Mode)9,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  Dn dn;
  char *pcVar8;
  uint uVar9;
  Dn dn_00;
  bool bVar10;
  Ea<(moira::Mode)9,_4> src;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  uVar9 = uVar5 & 0xffff;
  local_40 = op & 7;
  local_44 = *addr;
  *addr = local_44 + 2;
  local_3c = (*this->_vptr_Moira[6])(this);
  local_3c = local_3c & 0xffff;
  bVar10 = (str->style->syntax & ~MOIRA_MIT) == GNU;
  pcVar8 = ":";
  if (bVar10) {
    pcVar8 = ",";
  }
  if ((uVar5 & 0x83f8) == 0 || !bVar10) {
    cVar4 = 'd';
    lVar7 = 0;
    if ((uVar9 >> 0xb & 1) == 0) {
      do {
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = cVar4;
        cVar4 = "divu"[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
    }
    else {
      do {
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = cVar4;
        cVar4 = "fddivs"[lVar7 + 3];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
    }
    dn.raw = uVar9 >> 0xc & 7;
    dn_00.raw = uVar5 & 7;
    if ((uVar9 >> 10 & 1) == 0) {
      if ((dn.raw == dn_00.raw) && (str->style->syntax == MUSASHI)) {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = '.';
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = 'l';
        if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
          pcVar8 = str->ptr;
          str->ptr = pcVar8 + 1;
          *pcVar8 = ' ';
        }
        else {
          iVar2 = (str->tab).raw;
          pcVar8 = str->ptr;
          do {
            str->ptr = pcVar8 + 1;
            *pcVar8 = ' ';
            pcVar8 = str->ptr;
          } while (pcVar8 < str->base + iVar2);
        }
        StrWriter::operator<<(str,(Ea<(moira::Mode)9,_4> *)&local_44);
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ',';
        SVar3 = str->style->syntax;
        if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
          pcVar8 = str->ptr;
          str->ptr = pcVar8 + 1;
          *pcVar8 = ' ';
        }
      }
      else {
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = 'l';
        pcVar6 = str->ptr;
        SVar3 = str->style->syntax;
        str->ptr = pcVar6 + 1;
        if (2 < SVar3 - MOIRA_MIT) {
          *pcVar6 = '.';
          pcVar6 = str->ptr;
          str->ptr = pcVar6 + 1;
        }
        *pcVar6 = 'l';
        if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
          pcVar6 = str->ptr;
          str->ptr = pcVar6 + 1;
          *pcVar6 = ' ';
        }
        else {
          iVar2 = (str->tab).raw;
          pcVar6 = str->ptr;
          do {
            str->ptr = pcVar6 + 1;
            *pcVar6 = ' ';
            pcVar6 = str->ptr;
          } while (pcVar6 < str->base + iVar2);
        }
        StrWriter::operator<<(str,(Ea<(moira::Mode)9,_4> *)&local_44);
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = ',';
        SVar3 = str->style->syntax;
        if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
          pcVar6 = str->ptr;
          str->ptr = pcVar6 + 1;
          *pcVar6 = ' ';
        }
        StrWriter::operator<<(str,dn_00);
        cVar4 = *pcVar8;
        while (cVar4 != '\0') {
          pcVar8 = pcVar8 + 1;
          pcVar6 = str->ptr;
          str->ptr = pcVar6 + 1;
          *pcVar6 = cVar4;
          cVar4 = *pcVar8;
        }
      }
    }
    else {
      pcVar6 = str->ptr;
      SVar3 = str->style->syntax;
      str->ptr = pcVar6 + 1;
      if (2 < SVar3 - MOIRA_MIT) {
        *pcVar6 = '.';
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
      }
      *pcVar6 = 'l';
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        pcVar6 = str->ptr;
        do {
          str->ptr = pcVar6 + 1;
          *pcVar6 = ' ';
          pcVar6 = str->ptr;
        } while (pcVar6 < str->base + iVar2);
      }
      StrWriter::operator<<(str,(Ea<(moira::Mode)9,_4> *)&local_44);
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ',';
      SVar3 = str->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
      }
      StrWriter::operator<<(str,dn_00);
      cVar4 = *pcVar8;
      while (cVar4 != '\0') {
        pcVar8 = pcVar8 + 1;
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = cVar4;
        cVar4 = *pcVar8;
      }
    }
    StrWriter::operator<<(str,dn);
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      cVar4 = ';';
      lVar7 = 1;
      do {
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = cVar4;
        cVar4 = "trap%-2s  ; (2+)"[lVar7 + 10];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 7);
    }
    return;
  }
  *addr = uVar1;
  dasmIllegal<(moira::Instr)154,(moira::Mode)9,4>(this,str,addr,op);
  return;
}

Assistant:

void
Moira::dasmDivl(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dl  = Dn       ( _xxx____________(ext)      );
    auto dh  = Dn       ( _____________xxx(ext)      );

    auto fill = str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT ? "," : ":";

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            // Catch illegal extension words
            if (!isValidExt(I, M, op, ext)) {

                addr = old;
                dasmIllegal<I, M, S>(str, addr, op);
                return;
            }
            [[fallthrough]];

        default:

            (ext & 1 << 11) ? str << Ins<Instr::DIVS>{} : str << Ins<Instr::DIVU>{};

            if (ext & 1 << 10) {

                // DIVS.L <ea>,Dr:Dq    (64-bit dividend)
                str << Sz<S>{} << str.tab << src << Sep{} << dh << fill << dl;

            } else {

                // DIVSL.L <ea>,Dr:Dq   (32-bit dividend)
                if (dl.raw == dh.raw && str.style.syntax == Syntax::MUSASHI) {
                    str << Sz<S>{} << str.tab << src << Sep{} << dh;
                } else {
                    str << "l" << Sz<S>{} << str.tab << src << Sep{} << dh << fill << dl;

                }
            }
            str << Av<I, M, S>{};
    }
}